

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ccm.c
# Opt level: O1

int mbedtls_ccm_self_test(int verbose)

{
  size_t length;
  size_t iv_len;
  size_t add_len;
  size_t tag_len;
  int iVar1;
  uchar (*input) [32];
  long lVar2;
  uchar out [32];
  mbedtls_ccm_context ctx;
  
  ctx.cipher_ctx.cipher_info = (mbedtls_cipher_info_t *)0x0;
  ctx.cipher_ctx.key_bitlen = 0;
  ctx.cipher_ctx.operation = MBEDTLS_DECRYPT;
  ctx.cipher_ctx.add_padding = (_func_void_uchar_ptr_size_t_size_t *)0x0;
  ctx.cipher_ctx.get_padding = (_func_int_uchar_ptr_size_t_size_t_ptr *)0x0;
  ctx.cipher_ctx.unprocessed_data[0] = '\0';
  ctx.cipher_ctx.unprocessed_data[1] = '\0';
  ctx.cipher_ctx.unprocessed_data[2] = '\0';
  ctx.cipher_ctx.unprocessed_data[3] = '\0';
  ctx.cipher_ctx.unprocessed_data[4] = '\0';
  ctx.cipher_ctx.unprocessed_data[5] = '\0';
  ctx.cipher_ctx.unprocessed_data[6] = '\0';
  ctx.cipher_ctx.unprocessed_data[7] = '\0';
  ctx.cipher_ctx.unprocessed_data[8] = '\0';
  ctx.cipher_ctx.unprocessed_data[9] = '\0';
  ctx.cipher_ctx.unprocessed_data[10] = '\0';
  ctx.cipher_ctx.unprocessed_data[0xb] = '\0';
  ctx.cipher_ctx.unprocessed_data[0xc] = '\0';
  ctx.cipher_ctx.unprocessed_data[0xd] = '\0';
  ctx.cipher_ctx.unprocessed_data[0xe] = '\0';
  ctx.cipher_ctx.unprocessed_data[0xf] = '\0';
  ctx.cipher_ctx.unprocessed_len = 0;
  ctx.cipher_ctx.iv[0] = '\0';
  ctx.cipher_ctx.iv[1] = '\0';
  ctx.cipher_ctx.iv[2] = '\0';
  ctx.cipher_ctx.iv[3] = '\0';
  ctx.cipher_ctx.iv[4] = '\0';
  ctx.cipher_ctx.iv[5] = '\0';
  ctx.cipher_ctx.iv[6] = '\0';
  ctx.cipher_ctx.iv[7] = '\0';
  ctx.cipher_ctx.iv[8] = '\0';
  ctx.cipher_ctx.iv[9] = '\0';
  ctx.cipher_ctx.iv[10] = '\0';
  ctx.cipher_ctx.iv[0xb] = '\0';
  ctx.cipher_ctx.iv[0xc] = '\0';
  ctx.cipher_ctx.iv[0xd] = '\0';
  ctx.cipher_ctx.iv[0xe] = '\0';
  ctx.cipher_ctx.iv[0xf] = '\0';
  ctx.cipher_ctx.iv_size = 0;
  ctx.cipher_ctx.cipher_ctx = (void *)0x0;
  iVar1 = mbedtls_ccm_setkey(&ctx,MBEDTLS_CIPHER_ID_AES,"@ABCDEFGHIJKLMNO",0x80);
  if (iVar1 == 0) {
    input = res;
    lVar2 = 0;
    do {
      if (verbose != 0) {
        printf("  CCM-AES #%u: ");
      }
      length = *(size_t *)((long)msg_len + lVar2);
      iv_len = *(size_t *)((long)::iv_len + lVar2);
      add_len = *(size_t *)((long)::add_len + lVar2);
      tag_len = *(size_t *)((long)::tag_len + lVar2);
      iVar1 = ccm_auth_crypt(&ctx,0,length,"\x10\x11\x12\x13\x14\x15\x16\x17\x18\x19\x1a\x1b",iv_len
                             ,"",add_len," !\"#$%&\'()*+,-./01234567",out,out + length,tag_len);
      if ((((iVar1 != 0) || (iVar1 = bcmp(out,input,length + tag_len), iVar1 != 0)) ||
          (iVar1 = mbedtls_ccm_auth_decrypt
                             (&ctx,length,"\x10\x11\x12\x13\x14\x15\x16\x17\x18\x19\x1a\x1b",iv_len,
                              "",add_len,*input,out,*input + length,tag_len), iVar1 != 0)) ||
         (iVar1 = bcmp(out," !\"#$%&\'()*+,-./01234567",length), iVar1 != 0)) {
        if (verbose == 0) {
          return 1;
        }
        puts("failed");
        return 1;
      }
      if (verbose != 0) {
        puts("passed");
      }
      lVar2 = lVar2 + 8;
      input = input + 1;
    } while (lVar2 != 0x18);
    mbedtls_cipher_free(&ctx.cipher_ctx);
    lVar2 = 0;
    do {
      ctx.cipher_ctx.unprocessed_data[lVar2 + -0x20] = '\0';
      lVar2 = lVar2 + 1;
    } while (lVar2 != 0x58);
    iVar1 = 0;
    if (verbose != 0) {
      putchar(10);
      iVar1 = 0;
    }
  }
  else {
    iVar1 = 1;
    if (verbose != 0) {
      printf("  CCM: setup failed");
    }
  }
  return iVar1;
}

Assistant:

int mbedtls_ccm_self_test( int verbose )
{
    mbedtls_ccm_context ctx;
    unsigned char out[32];
    size_t i;
    int ret;

    mbedtls_ccm_init( &ctx );

    if( mbedtls_ccm_setkey( &ctx, MBEDTLS_CIPHER_ID_AES, key, 8 * sizeof key ) != 0 )
    {
        if( verbose != 0 )
            mbedtls_printf( "  CCM: setup failed" );

        return( 1 );
    }

    for( i = 0; i < NB_TESTS; i++ )
    {
        if( verbose != 0 )
            mbedtls_printf( "  CCM-AES #%u: ", (unsigned int) i + 1 );

        ret = mbedtls_ccm_encrypt_and_tag( &ctx, msg_len[i],
                                   iv, iv_len[i], ad, add_len[i],
                                   msg, out,
                                   out + msg_len[i], tag_len[i] );

        if( ret != 0 ||
            memcmp( out, res[i], msg_len[i] + tag_len[i] ) != 0 )
        {
            if( verbose != 0 )
                mbedtls_printf( "failed\n" );

            return( 1 );
        }

        ret = mbedtls_ccm_auth_decrypt( &ctx, msg_len[i],
                                iv, iv_len[i], ad, add_len[i],
                                res[i], out,
                                res[i] + msg_len[i], tag_len[i] );

        if( ret != 0 ||
            memcmp( out, msg, msg_len[i] ) != 0 )
        {
            if( verbose != 0 )
                mbedtls_printf( "failed\n" );

            return( 1 );
        }

        if( verbose != 0 )
            mbedtls_printf( "passed\n" );
    }

    mbedtls_ccm_free( &ctx );

    if( verbose != 0 )
        mbedtls_printf( "\n" );

    return( 0 );
}